

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O0

double declaration(bool is_const)

{
  bool bVar1;
  double value;
  double d;
  string local_110;
  undefined1 local_f0 [8];
  Token t2;
  string local_b8;
  undefined1 local_98 [8];
  string name;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  Token t;
  bool is_const_local;
  
  t.name.field_2._M_local_buf[0xf] = is_const;
  Token_stream::get((Token *)local_40,&ts);
  if (local_40[0] != 'a') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"name expected in declaration",&local_61);
    error(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  std::__cxx11::string::string((string *)local_98,(string *)&t.value);
  bVar1 = Symbol_table::is_declared(&st,(string *)local_98);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8," declared twice",
               (allocator<char> *)(t2.name.field_2._M_local_buf + 0xf));
    error((string *)local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(t2.name.field_2._M_local_buf + 0xf));
  }
  Token_stream::get((Token *)local_f0,&ts);
  if (local_f0[0] != '=') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"= missing in declaration of ",(allocator<char> *)((long)&d + 7)
              );
    error(&local_110,(string *)local_98);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&d + 7));
  }
  value = expression();
  Symbol_table::define_name
            (&st,(string *)local_98,value,(bool)(t.name.field_2._M_local_buf[0xf] & 1));
  Token::~Token((Token *)local_f0);
  std::__cxx11::string::~string((string *)local_98);
  Token::~Token((Token *)local_40);
  return value;
}

Assistant:

double declaration(bool is_const = false)
{
	Token t = ts.get();
	if (t.kind != name)
		error("name expected in declaration");
	string name = t.name;
	if (st.is_declared(name))
		error(name, " declared twice");
	Token t2 = ts.get();
	if (t2.kind != '=')
		error("= missing in declaration of ", name);
	double d = expression();
	st.define_name(name, d, is_const);
	return d;
}